

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFFileInput.cpp
# Opt level: O3

EStatusCode __thiscall CFFFileInput::ReadPrivateDicts(CFFFileInput *this,unsigned_short inFontIndex)

{
  ushort uVar1;
  EStatusCode EVar2;
  ulong *puVar3;
  ulong *puVar4;
  long lVar5;
  ulong uVar6;
  
  uVar1 = this->mFontsCount;
  uVar6 = (ulong)uVar1;
  puVar3 = (ulong *)operator_new__(uVar6 * 0x48 + 8);
  *puVar3 = uVar6;
  if (uVar6 != 0) {
    puVar4 = puVar3 + 4;
    lVar5 = (ulong)uVar1 * 0x48;
    do {
      *(undefined4 *)puVar4 = 0;
      puVar4[1] = 0;
      puVar4[2] = (ulong)puVar4;
      puVar4[3] = (ulong)puVar4;
      puVar4[-3] = 0;
      puVar4[-2] = 0;
      puVar4[4] = 0;
      puVar4[5] = 0;
      puVar4 = puVar4 + 9;
      lVar5 = lVar5 + -0x48;
    } while (lVar5 != 0);
  }
  this->mPrivateDicts = (PrivateDictInfo *)(puVar3 + 1);
  EVar2 = ReadPrivateDict(this,(UShortToDictOperandListMap *)
                               (&(this->mTopDictIndex->mTopDict)._M_t._M_impl.field_0x0 +
                               (uint)inFontIndex * 0x50),
                          (PrivateDictInfo *)(puVar3 + 1) + inFontIndex);
  if (EVar2 != eSuccess) {
    return EVar2;
  }
  EVar2 = CFFPrimitiveReader::GetInternalState(&this->mPrimitivesReader);
  return EVar2;
}

Assistant:

EStatusCode CFFFileInput::ReadPrivateDicts(unsigned short inFontIndex)
{
	// allocate all (to maintain indexing...whatever), but read just the relevant font dict
	mPrivateDicts = new PrivateDictInfo[mFontsCount];
	EStatusCode status = ReadPrivateDict(mTopDictIndex[inFontIndex].mTopDict,mPrivateDicts + inFontIndex);

	if(status != PDFHummus::eSuccess)
		return status;
	else
		return mPrimitivesReader.GetInternalState();	
}